

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveBuilder.cpp
# Opt level: O0

bool __thiscall
ZAP::ArchiveBuilder::buildFile(ArchiveBuilder *this,string *filename,Compression compression)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ostream local_228 [8];
  ofstream stream;
  Compression compression_local;
  string *filename_local;
  ArchiveBuilder *this_local;
  
  _Var2 = std::operator|(_S_out,_S_trunc);
  _Var2 = std::operator|(_Var2,_S_bin);
  std::ofstream::ofstream(local_228,(string *)filename,_Var2);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = build(this,local_228,compression);
  }
  std::ofstream::~ofstream(local_228);
  return this_local._7_1_;
}

Assistant:

bool ArchiveBuilder::buildFile(const std::string &filename, Compression compression)
	{
		std::ofstream stream(filename, std::ios::out | std::ios::trunc | std::ios::binary);
		if (!stream.is_open())
		{
			return false;
		}
		return build(stream, compression);
	}